

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ref.h
# Opt level: O0

void anurbs::Ref<anurbs::Brep>::register_python(module *m)

{
  char *name_00;
  class_<anurbs::Ref<anurbs::Brep>> *pcVar1;
  code *local_e0;
  undefined8 local_d8;
  code *local_d0;
  undefined8 local_c8;
  code *local_c0;
  undefined8 local_b8;
  code *local_b0;
  undefined8 local_a8;
  type local_9a;
  type local_99;
  handle local_98;
  class_<anurbs::Ref<anurbs::Brep>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  string name;
  module *m_local;
  
  name.field_2._8_8_ = m;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Ref",&local_51);
  Brep::type_name_abi_cxx11_();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 &local_50,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_98.m_ptr = *(PyObject **)name.field_2._8_8_;
  name_00 = (char *)std::__cxx11::string::c_str();
  pybind11::class_<anurbs::Ref<anurbs::Brep>_>::class_<>(&local_90,local_98,name_00);
  pcVar1 = (class_<anurbs::Ref<anurbs::Brep>> *)
           pybind11::class_<anurbs::Ref<anurbs::Brep>>::
           def<anurbs::Ref<anurbs::Brep>::register_python(pybind11::module&)::_lambda(anurbs::Ref<anurbs::Brep>const&)_1_>
                     ((class_<anurbs::Ref<anurbs::Brep>> *)&local_90,"__len__",&local_99);
  pcVar1 = (class_<anurbs::Ref<anurbs::Brep>> *)
           pybind11::class_<anurbs::Ref<anurbs::Brep>>::
           def<anurbs::Ref<anurbs::Brep>::register_python(pybind11::module&)::_lambda(anurbs::Ref<anurbs::Brep>const&,int)_1_>
                     (pcVar1,"__getitem__",&local_9a);
  local_b0 = key_abi_cxx11_;
  local_a8 = 0;
  pcVar1 = (class_<anurbs::Ref<anurbs::Brep>> *)
           pybind11::class_<anurbs::Ref<anurbs::Brep>>::
           def_property_readonly<std::__cxx11::string(anurbs::Ref<anurbs::Brep>::*)()const>
                     (pcVar1,"key",(offset_in_Model_to_subr *)&local_b0);
  local_c0 = type_name_abi_cxx11_;
  local_b8 = 0;
  pcVar1 = (class_<anurbs::Ref<anurbs::Brep>> *)
           pybind11::class_<anurbs::Ref<anurbs::Brep>>::
           def_property_readonly<std::__cxx11::string(anurbs::Ref<anurbs::Brep>::*)()const>
                     (pcVar1,"type",(offset_in_Model_to_subr *)&local_c0);
  local_d0 = data;
  local_c8 = 0;
  pcVar1 = (class_<anurbs::Ref<anurbs::Brep>> *)
           pybind11::class_<anurbs::Ref<anurbs::Brep>>::
           def_property_readonly<std::shared_ptr<anurbs::Brep>(anurbs::Ref<anurbs::Brep>::*)()const>
                     (pcVar1,"data",(offset_in_Model_to_subr *)&local_d0);
  local_e0 = attributes;
  local_d8 = 0;
  pybind11::class_<anurbs::Ref<anurbs::Brep>>::
  def_property_readonly<std::shared_ptr<anurbs::Attributes>(anurbs::Ref<anurbs::Brep>::*)()const>
            (pcVar1,"attributes",(offset_in_Model_to_subr *)&local_e0);
  pybind11::class_<anurbs::Ref<anurbs::Brep>_>::~class_(&local_90);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

static void register_python(pybind11::module& m)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        const std::string name = std::string("Ref") + TData::type_name();

        py::class_<Type>(m, name.c_str())
            // methods
            .def("__len__", [](const Type& self) { return 2; })
            .def("__getitem__", [](const Type& self, const int i) -> py::object {
                switch (i) {
                case 0:
                    return py::cast(self.key());
                case 1:
                    return py::cast(self.data());
                default:
                    throw py::index_error();
                }
            })
            // read-only properties
            .def_property_readonly("key", &Type::key)
            .def_property_readonly("type", &Type::type_name)
            .def_property_readonly("data", &Type::data)
            .def_property_readonly("attributes", &Type::attributes)
        ;
    }